

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O2

size_t __thiscall
Simple::Lib::
ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
::SignalLink::add_before(SignalLink *this,CbFunction *cb)

{
  SignalLink *pSVar1;
  SignalLink *this_00;
  
  this_00 = (SignalLink *)operator_new(0x38);
  SignalLink(this_00,cb);
  pSVar1 = this->prev;
  this_00->prev = pSVar1;
  this_00->next = this;
  pSVar1->next = this_00;
  this->prev = this_00;
  return (size_t)this_00;
}

Assistant:

size_t
    add_before (const CbFunction &cb)
    {
      SignalLink *link = new SignalLink (cb);
      link->prev = prev; // link to last
      link->next = this;
      prev->next = link; // link from last
      prev = link;
      static_assert (sizeof (link) == sizeof (size_t), "sizeof size_t");
      return size_t (link);
    }